

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O3

bool __thiscall ExecutorX86::RemoveBreakpoint(ExecutorX86 *this,uint instruction)

{
  uint uVar1;
  uint uVar2;
  Breakpoint *pBVar3;
  uchar *puVar4;
  char *__function;
  uint uVar5;
  ulong uVar6;
  
  uVar1 = (this->instAddress).count;
  if (uVar1 < instruction) {
    NULLC::SafeSprintf(this->execErrorBuffer,0x10000,"ERROR: break position out of code range");
  }
  else {
    uVar2 = (this->breakInstructions).count;
    if ((ulong)uVar2 != 0) {
      uVar6 = 0;
      do {
        uVar5 = (uint)uVar6;
        if ((this->breakInstructions).data[uVar6].instIndex != instruction) {
          uVar5 = 0xffffffff;
        }
        uVar6 = uVar6 + 1;
      } while ((uVar6 < uVar2) && (uVar5 == 0xffffffff));
      if (uVar5 != 0xffffffff) {
        if (uVar2 <= uVar5) {
          __function = 
          "T &FastVector<ExecutorX86::Breakpoint>::operator[](unsigned int) [T = ExecutorX86::Breakpoint, zeroNewMemory = false, skipConstructor = false]"
          ;
LAB_00146756:
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x7f,__function);
        }
        pBVar3 = (this->breakInstructions).data;
        uVar2 = pBVar3[uVar5].instIndex;
        if (uVar1 <= uVar2) {
          __function = 
          "T &FastVector<unsigned char *>::operator[](unsigned int) [T = unsigned char *, zeroNewMemory = false, skipConstructor = false]"
          ;
          goto LAB_00146756;
        }
        puVar4 = (this->instAddress).data[uVar2];
        if (*puVar4 == 0xcc) {
          *puVar4 = pBVar3[uVar5].oldOpcode;
          return true;
        }
      }
    }
    NULLC::SafeSprintf(this->execErrorBuffer,0x10000,
                       "ERROR: there is no breakpoint at instruction %d");
  }
  this->execErrorMessage = this->execErrorBuffer;
  return false;
}

Assistant:

bool ExecutorX86::RemoveBreakpoint(unsigned int instruction)
{
	if(instruction > instAddress.size())
	{
		NULLC::SafeSprintf(execErrorBuffer, NULLC_ERROR_BUFFER_SIZE, "ERROR: break position out of code range");
		execErrorMessage = execErrorBuffer;
		return false;
	}

	unsigned index = ~0u;
	for(unsigned i = 0; i < breakInstructions.size() && index == ~0u; i++)
	{
		if(breakInstructions[i].instIndex == instruction)
			index = i;
	}

	if(index == ~0u || *instAddress[breakInstructions[index].instIndex] != 0xcc)
	{
		NULLC::SafeSprintf(execErrorBuffer, NULLC_ERROR_BUFFER_SIZE, "ERROR: there is no breakpoint at instruction %d", instruction);
		execErrorMessage = execErrorBuffer;
		return false;
	}

	*instAddress[breakInstructions[index].instIndex] = breakInstructions[index].oldOpcode;
	return true;
}